

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::InternalException::InternalException<short,unsigned_long,unsigned_long>
          (InternalException *this,string *msg,short params,unsigned_long params_1,
          unsigned_long params_2)

{
  undefined6 in_register_00000012;
  unsigned_long in_R9;
  string local_30;
  
  Exception::ConstructMessage<short,unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)CONCAT62(in_register_00000012,params),
             (short)params_1,params_2,in_R9);
  duckdb::InternalException::InternalException(this,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}